

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_init(flexfloat_t *obj,flexfloat_desc_t desc)

{
  flexfloat_t *obj_local;
  flexfloat_desc_t desc_local;
  
  obj->value = 0.0;
  obj->desc = desc;
  return;
}

Assistant:

INLINE void ff_init(flexfloat_t *obj, flexfloat_desc_t desc) {
    obj->value = 0.0;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = 0.0;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
}